

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TiledRgbaInputFile::FromYa::readTile(FromYa *this,int dx,int dy,int lx,int ly)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ArgExc *this_00;
  long lVar5;
  ulong uVar6;
  Rgba *pRVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint n;
  long lVar11;
  Box2i dw;
  TiledInputFile local_1b8;
  ostream local_1a8 [376];
  
  if (this->_fbBase != (Rgba *)0x0) {
    TiledInputFile::readTile(this->_inputFile,dx,dy,lx,ly);
    TiledInputFile::dataWindowForTile(&local_1b8,(int)this->_inputFile,dx,dy,lx);
    if (local_1b8.super_GenericInputFile._vptr_GenericInputFile._4_4_ <= local_1b8._data._4_4_) {
      iVar2 = (int)local_1b8._data - (int)local_1b8.super_GenericInputFile._vptr_GenericInputFile;
      n = iVar2 + 1;
      lVar11 = 0;
      lVar10 = 0;
      lVar9 = (long)local_1b8.super_GenericInputFile._vptr_GenericInputFile._4_4_;
      do {
        if (-1 < iVar2) {
          pRVar7 = (this->_buf)._data;
          lVar5 = (this->_buf)._sizeY * lVar11;
          uVar6 = 0;
          do {
            *(unsigned_short *)((long)&pRVar7[uVar6].r._h + lVar5) = 0;
            *(unsigned_short *)((long)&pRVar7[uVar6].b._h + lVar5) = 0;
            uVar6 = uVar6 + 1;
          } while (n != uVar6);
        }
        pRVar7 = (this->_buf)._data + (this->_buf)._sizeY * lVar10;
        RgbaYca::YCAtoRGBA(&this->_yw,n,pRVar7,pRVar7);
        if ((int)local_1b8.super_GenericInputFile._vptr_GenericInputFile <= (int)local_1b8._data) {
          lVar8 = 0;
          lVar5 = (long)(int)local_1b8.super_GenericInputFile._vptr_GenericInputFile;
          do {
            this->_fbBase[this->_fbXStride * lVar5 + this->_fbYStride * lVar9] =
                 *(Rgba *)((long)&(((this->_buf)._data)->r)._h +
                          lVar8 + (this->_buf)._sizeY * lVar11);
            lVar8 = lVar8 + 8;
            bVar1 = lVar5 < (int)local_1b8._data;
            lVar5 = lVar5 + 1;
          } while (bVar1);
        }
        lVar10 = lVar10 + 1;
        lVar11 = lVar11 + 8;
        bVar1 = lVar9 < local_1b8._data._4_4_;
        lVar9 = lVar9 + 1;
      } while (bVar1);
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,
             "No frame buffer was specified as the pixel data destination for image file \"",0x4c);
  pcVar3 = TiledInputFile::fileName(this->_inputFile);
  poVar4 = std::operator<<(local_1a8,pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)&local_1b8);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
TiledRgbaInputFile::FromYa::readTile (int dx, int dy, int lx, int ly)
{
    if (_fbBase == 0)
    {
	THROW (IEX_NAMESPACE::ArgExc, "No frame buffer was specified as the "
			    "pixel data destination for image file "
			    "\"" << _inputFile.fileName() << "\".");
    }

    //
    // Read the tile requested by the caller into _buf.
    //
    
    _inputFile.readTile (dx, dy, lx, ly);

    //
    // Convert the luminance/alpha pixels to RGBA
    // and copy them into the caller's frame buffer.
    //

    Box2i dw = _inputFile.dataWindowForTile (dx, dy, lx, ly);
    int width = dw.max.x - dw.min.x + 1;

    for (int y = dw.min.y, y1 = 0; y <= dw.max.y; ++y, ++y1)
    {
	for (int x1 = 0; x1 < width; ++x1)
	{
	    _buf[y1][x1].r = 0;
	    _buf[y1][x1].b = 0;
	}

	YCAtoRGBA (_yw, width, _buf[y1], _buf[y1]);

	for (int x = dw.min.x, x1 = 0; x <= dw.max.x; ++x, ++x1)
	{
	    _fbBase[x * _fbXStride + y * _fbYStride] = _buf[y1][x1];
	}
    }
}